

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O0

void __thiscall diy::Master::Command<void>::execute(Command<void> *this,void *b,ProxyWithLink *cp)

{
  ProxyWithLink *in_RSI;
  void *in_RDI;
  
  Catch::clara::std::function<void_(void_*,_const_diy::Master::ProxyWithLink_&)>::operator()
            ((function<void_(void_*,_const_diy::Master::ProxyWithLink_&)> *)cp,in_RDI,in_RSI);
  return;
}

Assistant:

void  execute(void* b, const ProxyWithLink& cp) const override                { f(static_cast<Block*>(b), cp); }